

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxweightst.hpp
# Opt level: O2

void __thiscall
soplex::SPxWeightST<double>::setupWeights(SPxWeightST<double> *this,SPxSolverBase<double> *base)

{
  VectorBase<double> *this_00;
  double dVar1;
  Type TVar2;
  Representation RVar3;
  int iVar4;
  bool *pbVar5;
  double *pdVar6;
  pointer pdVar7;
  long lVar8;
  ulong uVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double local_88;
  
  dVar10 = SPxSolverBase<double>::epsilon(base);
  local_88 = 1.0;
  for (lVar8 = 0;
      lVar8 < (base->super_SPxLPBase<double>).super_LPColSetBase<double>.super_SVSetBase<double>.set
              .thenum; lVar8 = lVar8 + 1) {
    dVar11 = (base->super_SPxLPBase<double>).super_LPColSetBase<double>.up.val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[lVar8];
    pdVar6 = (double *)infinity();
    if ((dVar11 < *pdVar6) &&
       (dVar11 = ABS((base->super_SPxLPBase<double>).super_LPColSetBase<double>.up.val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar8]), local_88 < dVar11)) {
      local_88 = dVar11;
    }
    dVar11 = (base->super_SPxLPBase<double>).super_LPColSetBase<double>.low.val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[lVar8];
    pdVar6 = (double *)infinity();
    if ((-*pdVar6 < dVar11) &&
       (dVar11 = ABS((base->super_SPxLPBase<double>).super_LPColSetBase<double>.low.val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar8]), local_88 < dVar11)) {
      local_88 = dVar11;
    }
  }
  for (lVar8 = 0;
      lVar8 < (base->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.set
              .thenum; lVar8 = lVar8 + 1) {
    dVar11 = (base->super_SPxLPBase<double>).super_LPRowSetBase<double>.right.val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[lVar8];
    pdVar6 = (double *)infinity();
    if ((dVar11 < *pdVar6) &&
       (dVar11 = ABS((base->super_SPxLPBase<double>).super_LPRowSetBase<double>.right.val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar8]), local_88 < dVar11)) {
      local_88 = dVar11;
    }
    dVar11 = (base->super_SPxLPBase<double>).super_LPRowSetBase<double>.left.val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[lVar8];
    pdVar6 = (double *)infinity();
    if ((-*pdVar6 < dVar11) &&
       (dVar11 = ABS((base->super_SPxLPBase<double>).super_LPRowSetBase<double>.left.val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar8]), local_88 < dVar11)) {
      local_88 = dVar11;
    }
  }
  this_00 = &(base->super_SPxLPBase<double>).super_LPColSetBase<double>.object;
  TVar2 = base->theType;
  RVar3 = base->theRep;
  dVar11 = VectorBase<double>::maxAbs(this_00);
  if (TVar2 * RVar3 < 1) {
    local_88 = 0.01 / local_88;
    for (uVar9 = (ulong)(uint)(base->super_SPxLPBase<double>).super_LPColSetBase<double>.
                              super_SVSetBase<double>.set.thenum; 0 < (int)uVar9; uVar9 = uVar9 - 1)
    {
      dVar14 = (double)((base->super_SPxLPBase<double>).super_LPColSetBase<double>.
                        super_SVSetBase<double>.set.theitem
                        [(base->super_SPxLPBase<double>).super_LPColSetBase<double>.
                         super_SVSetBase<double>.set.thekey[uVar9 - 1].idx].data.
                        super_SVectorBase<double>.memused + -1) * local_88 * 0.0001;
      dVar13 = (base->super_SPxLPBase<double>).super_LPColSetBase<double>.object.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[uVar9 - 1] * (1.0 / dVar11);
      dVar15 = (base->super_SPxLPBase<double>).super_LPColSetBase<double>.up.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[uVar9 - 1];
      dVar1 = (base->super_SPxLPBase<double>).super_LPColSetBase<double>.low.val.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[uVar9 - 1];
      pdVar6 = (double *)infinity();
      dVar12 = (base->super_SPxLPBase<double>).super_LPColSetBase<double>.low.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[uVar9 - 1];
      if (*pdVar6 <= dVar15) {
        pdVar6 = (double *)infinity();
        pdVar7 = (this->colWeight).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (dVar12 <= -*pdVar6) {
          pdVar7[uVar9 - 1] = (dVar14 + -10000.0) - ABS(dVar13);
        }
        else {
          dVar13 = 0.0 - dVar13;
LAB_001fbf8d:
          pdVar7[uVar9 - 1] = dVar14 + dVar13 + dVar1 * local_88;
          (this->colUp).data[uVar9 - 1] = false;
        }
      }
      else if (dVar10 <= ABS(dVar12 - (base->super_SPxLPBase<double>).super_LPColSetBase<double>.up.
                                      val.super__Vector_base<double,_std::allocator<double>_>.
                                      _M_impl.super__Vector_impl_data._M_start[uVar9 - 1])) {
        dVar15 = dVar15 * local_88;
        pdVar6 = (double *)infinity();
        if (dVar12 <= -*pdVar6) {
          dVar15 = dVar13 + (0.0 - dVar15);
          pdVar7 = (this->colWeight).data.super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        }
        else {
          pdVar7 = (this->colWeight).data.super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          if (dVar13 <= 0.0) {
            dVar13 = 1.0 - dVar13;
            goto LAB_001fbf8d;
          }
          dVar15 = (dVar13 + 1.0) - dVar15;
        }
        pdVar7[uVar9 - 1] = dVar14 + dVar15;
        (this->colUp).data[uVar9 - 1] = true;
      }
      else {
        (this->colWeight).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[uVar9 - 1] = ABS(dVar13) + dVar14 + 100000.0;
      }
    }
    for (uVar9 = (ulong)(uint)(base->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                              super_SVSetBase<double>.set.thenum; 0 < (int)uVar9; uVar9 = uVar9 - 1)
    {
      dVar14 = (base->super_SPxLPBase<double>).super_LPRowSetBase<double>.right.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[uVar9 - 1] * local_88;
      dVar13 = (base->super_SPxLPBase<double>).super_LPRowSetBase<double>.left.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[uVar9 - 1] * local_88;
      dVar12 = VectorBase<double>::operator*
                         (this_00,(SVectorBase<double> *)
                                  ((base->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                                   super_SVSetBase<double>.set.theitem +
                                  (base->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                                  super_SVSetBase<double>.set.thekey[uVar9 - 1].idx));
      dVar12 = dVar12 * (1.0 / dVar11);
      dVar15 = (base->super_SPxLPBase<double>).super_LPRowSetBase<double>.right.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[uVar9 - 1];
      pdVar6 = (double *)infinity();
      dVar1 = (base->super_SPxLPBase<double>).super_LPRowSetBase<double>.left.val.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[uVar9 - 1];
      if (*pdVar6 <= dVar15) {
        pdVar6 = (double *)infinity();
        pdVar7 = (this->rowWeight).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (dVar1 <= -*pdVar6) {
          dVar15 = -100000.0 - ABS(dVar12);
          goto LAB_001fc213;
        }
        pdVar7[uVar9 - 1] = (dVar13 + 0.0) - dVar12;
LAB_001fc1a3:
        (this->rowRight).data[uVar9 - 1] = false;
      }
      else if (dVar10 <= ABS(dVar1 - (base->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                                     right.val.super__Vector_base<double,_std::allocator<double>_>.
                                     _M_impl.super__Vector_impl_data._M_start[uVar9 - 1])) {
        pdVar6 = (double *)infinity();
        if (dVar1 <= -*pdVar6) {
          (this->rowWeight).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar9 - 1] = (0.0 - dVar14) + dVar12;
        }
        else {
          if (dVar12 <= 0.0) {
            (this->rowWeight).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar9 - 1] = dVar13 + (0.0 - dVar12);
            goto LAB_001fc1a3;
          }
          (this->rowWeight).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar9 - 1] = dVar12 - dVar14;
        }
        (this->rowRight).data[uVar9 - 1] = true;
      }
      else {
        dVar15 = ABS(dVar12) + 10000.0;
        pdVar7 = (this->rowWeight).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
LAB_001fc213:
        pdVar7[uVar9 - 1] = dVar15;
      }
    }
  }
  else {
    iVar4 = (base->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.set.
            thenum;
    local_88 = 1.0 / local_88;
    for (uVar9 = (ulong)(uint)(base->super_SPxLPBase<double>).super_LPColSetBase<double>.
                              super_SVSetBase<double>.set.thenum; 0 < (int)uVar9; uVar9 = uVar9 - 1)
    {
      dVar12 = (double)((base->super_SPxLPBase<double>).super_LPColSetBase<double>.
                        super_SVSetBase<double>.set.theitem
                        [(base->super_SPxLPBase<double>).super_LPColSetBase<double>.
                         super_SVSetBase<double>.set.thekey[uVar9 - 1].idx].data.
                        super_SVectorBase<double>.memused + -1) * ((0.001 / dVar11) / (double)iVar4)
      ;
      dVar13 = (base->super_SPxLPBase<double>).super_LPColSetBase<double>.object.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[uVar9 - 1] * (0.001 / dVar11);
      dVar15 = (base->super_SPxLPBase<double>).super_LPColSetBase<double>.up.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[uVar9 - 1];
      dVar14 = (base->super_SPxLPBase<double>).super_LPColSetBase<double>.low.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[uVar9 - 1] * local_88;
      pdVar6 = (double *)infinity();
      dVar1 = (base->super_SPxLPBase<double>).super_LPColSetBase<double>.low.val.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[uVar9 - 1];
      if (*pdVar6 <= dVar15) {
        pdVar6 = (double *)infinity();
        pdVar7 = (this->colWeight).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (dVar1 <= -*pdVar6) {
          dVar13 = (dVar12 + -10000.0) - ABS(dVar13);
LAB_001fbc31:
          pdVar7[uVar9 - 1] = dVar13;
        }
        else {
          pdVar7[uVar9 - 1] = (dVar12 + dVar14 + 10.0) - dVar13;
          (this->colUp).data[uVar9 - 1] = false;
        }
      }
      else {
        if (dVar10 <= ABS(dVar1 - (base->super_SPxLPBase<double>).super_LPColSetBase<double>.up.val.
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_start[uVar9 - 1])) {
          dVar15 = dVar15 * local_88;
          pdVar6 = (double *)infinity();
          pdVar7 = (this->colWeight).data.super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          if (dVar1 <= -*pdVar6) {
            pdVar7[uVar9 - 1] = dVar12 + dVar13 + (10.0 - dVar15);
            (this->colUp).data[uVar9 - 1] = true;
            goto LAB_001fbc70;
          }
          dVar12 = dVar12 + ((dVar14 + 10.0) - dVar15);
          pbVar5 = (this->colUp).data;
          if (ABS(dVar15) < ABS(dVar14)) {
            pbVar5[uVar9 - 1] = true;
            dVar13 = dVar13 + dVar12;
            goto LAB_001fbc31;
          }
          pbVar5[uVar9 - 1] = false;
          dVar12 = dVar12 - dVar13;
        }
        else {
          dVar12 = ABS(dVar13) + dVar12 + 100000.0;
          pdVar7 = (this->colWeight).data.super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        }
        pdVar7[uVar9 - 1] = dVar12;
      }
LAB_001fbc70:
    }
    for (uVar9 = (ulong)(uint)(base->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                              super_SVSetBase<double>.set.thenum; 0 < (int)uVar9; uVar9 = uVar9 - 1)
    {
      dVar11 = (base->super_SPxLPBase<double>).super_LPRowSetBase<double>.right.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[uVar9 - 1];
      pdVar6 = (double *)infinity();
      dVar15 = (base->super_SPxLPBase<double>).super_LPRowSetBase<double>.left.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[uVar9 - 1];
      if (*pdVar6 <= dVar11) {
        pdVar6 = (double *)infinity();
        if (dVar15 <= -*pdVar6) {
          (this->rowWeight).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar9 - 1] = -100000.0;
        }
        else {
          (this->rowWeight).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar9 - 1] =
               (base->super_SPxLPBase<double>).super_LPRowSetBase<double>.left.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[uVar9 - 1] * local_88 + 0.0;
          (this->rowRight).data[uVar9 - 1] = false;
        }
      }
      else if (dVar10 <= ABS(dVar15 - (base->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                                      right.val.super__Vector_base<double,_std::allocator<double>_>.
                                      _M_impl.super__Vector_impl_data._M_start[uVar9 - 1])) {
        pdVar6 = (double *)infinity();
        dVar11 = (base->super_SPxLPBase<double>).super_LPRowSetBase<double>.right.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[uVar9 - 1] * local_88;
        if (dVar15 <= -*pdVar6) {
          (this->rowWeight).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar9 - 1] = 0.0 - dVar11;
          (this->rowRight).data[uVar9 - 1] = true;
        }
        else {
          dVar15 = (base->super_SPxLPBase<double>).super_LPRowSetBase<double>.left.val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar9 - 1] * local_88;
          (this->rowWeight).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar9 - 1] = (dVar15 + 0.0) - dVar11;
          (this->rowRight).data[uVar9 - 1] = ABS(dVar11) < ABS(dVar15);
        }
      }
      else {
        (this->rowWeight).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[uVar9 - 1] = 0.0;
      }
    }
  }
  return;
}

Assistant:

void SPxWeightST<R>::setupWeights(SPxSolverBase<R>& base)
{
   const VectorBase<R>& obj  = base.maxObj();
   const VectorBase<R>& low  = base.lower();
   const VectorBase<R>& up   = base.upper();
   const VectorBase<R>& rhs  = base.rhs();
   const VectorBase<R>& lhs  = base.lhs();
   int    i;

   R eps    = base.epsilon();
   R maxabs = 1.0;

   // find absolut biggest entry in bounds and left-/right hand side
   for(i = 0; i < base.nCols(); i++)
   {
      if((up[i] < R(infinity)) && (spxAbs(up[i]) > maxabs))
         maxabs = spxAbs(up[i]);

      if((low[i] > R(-infinity)) && (spxAbs(low[i]) > maxabs))
         maxabs = spxAbs(low[i]);
   }

   for(i = 0; i < base.nRows(); i++)
   {
      if((rhs[i] < R(infinity)) && (spxAbs(rhs[i]) > maxabs))
         maxabs = spxAbs(rhs[i]);

      if((lhs[i] > R(-infinity)) && (spxAbs(lhs[i]) > maxabs))
         maxabs = spxAbs(lhs[i]);
   }

   /**@todo The comments are wrong. The first is for dual simplex and
    *       the secound for primal one. Is anything else wrong?
    *       Also the values are nearly the same for both cases.
    *       Should this be ? Changed the values for
    *       r_fixed to 0 because of maros-r7. It is not clear why
    *       this makes a difference because all constraints in that
    *       instance are of equality type.
    *       Why is rowRight sometimes not set?
    */
   if(base.rep() * base.type() > 0)             // primal simplex
   {
      const R ax            = 1e-3 / obj.maxAbs();
      const R bx            = 1.0 / maxabs;
      const R nne           = ax / base.nRows();  // 1e-4 * ax;
      const R c_fixed       = 1e+5;
      const R r_fixed       = 0; // TK20010103: was 1e+4 (maros-r7)
      const R c_dbl_bounded = 1e+1;
      const R r_dbl_bounded = 0;
      const R c_bounded     = 1e+1;
      const R r_bounded     = 0;
      const R c_free        = -1e+4;
      const R r_free        = -1e+5;

      for(i = base.nCols() - 1; i >= 0; i--)
      {
         R n = nne * (base.colVector(i).size() - 1); // very small value that is zero for col singletons
         R x = ax * obj[i]; // this is at most 1e-3, probably a lot smaller
         R u = bx * up [i]; // this is at most 1, probably a lot smaller
         R l = bx * low[i]; // this is at most 1, probably a lot smaller

         if(up[i] < R(infinity))
         {
            if(spxAbs(low[i] - up[i]) < eps)
               colWeight[i] = c_fixed + n + spxAbs(x);
            else if(low[i] > R(-infinity))
            {
               colWeight[i] = c_dbl_bounded + l - u + n;

               l = spxAbs(l);
               u = spxAbs(u);

               if(u < l)
               {
                  colUp[i]      = true;
                  colWeight[i] += x;
               }
               else
               {
                  colUp[i]      = false;
                  colWeight[i] -= x;
               }
            }
            else
            {
               colWeight[i] = c_bounded - u + x + n;
               colUp[i]     = true;
            }
         }
         else
         {
            if(low[i] > R(-infinity))
            {
               colWeight[i] = c_bounded + l + n - x;
               colUp[i]     = false;
            }
            else
            {
               colWeight[i] = c_free + n - spxAbs(x);
            }
         }
      }

      for(i = base.nRows() - 1; i >= 0; i--)
      {
         if(rhs[i] < R(infinity))
         {
            if(spxAbs(lhs[i] - rhs[i]) < eps)
            {
               rowWeight[i] = r_fixed;
            }
            else if(lhs[i] > R(-infinity))
            {
               R u = bx * rhs[i];
               R l = bx * lhs[i];

               rowWeight[i] = r_dbl_bounded + l - u;
               rowRight[i]  = spxAbs(u) < spxAbs(l);
            }
            else
            {
               rowWeight[i] = r_bounded - bx * rhs[i];
               rowRight[i]  = true;
            }
         }
         else
         {
            if(lhs[i] > R(-infinity))
            {
               rowWeight[i] = r_bounded + bx * lhs[i];
               rowRight[i]  = false;
            }
            else
            {
               rowWeight[i] = r_free;
            }
         }
      }
   }
   else
   {
      assert(base.rep() * base.type() < 0);           // dual simplex

      const R ax            = 1.0  / obj.maxAbs();
      const R bx            = 1e-2 / maxabs;
      const R nne           = 1e-4 * bx;
      const R c_fixed       = 1e+5;
      const R r_fixed       = 1e+4;
      const R c_dbl_bounded = 1;
      const R r_dbl_bounded = 0;
      const R c_bounded     = 0;
      const R r_bounded     = 0;
      const R c_free        = -1e+4;
      const R r_free        = -1e+5;

      for(i = base.nCols() - 1; i >= 0; i--)
      {
         R n = nne * (base.colVector(i).size() - 1);
         R x = ax  * obj[i];
         R u = bx  * up [i];
         R l = bx  * low[i];

         if(up[i] < R(infinity))
         {
            if(spxAbs(low[i] - up[i]) < eps)
               colWeight[i] = c_fixed + n + spxAbs(x);
            else if(low[i] > R(-infinity))
            {
               if(x > 0)
               {
                  colWeight[i] = c_dbl_bounded + x - u + n;
                  colUp[i]     = true;
               }
               else
               {
                  colWeight[i] = c_dbl_bounded - x + l + n;
                  colUp[i]     = false;
               }
            }
            else
            {
               colWeight[i] = c_bounded - u + x + n;
               colUp[i]     = true;
            }
         }
         else
         {
            if(low[i] > R(-infinity))
            {
               colWeight[i] = c_bounded - x + l + n;
               colUp[i]     = false;
            }
            else
               colWeight[i] = c_free + n - spxAbs(x);
         }
      }

      for(i = base.nRows() - 1; i >= 0; i--)
      {
         const R len1 = 1; // (base.rowVector(i).length() + base.epsilon());
         R n    = 0;  // nne * (base.rowVector(i).size() - 1);
         R u    = bx * len1 * rhs[i];
         R l    = bx * len1 * lhs[i];
         R x    = ax * len1 * (obj * base.rowVector(i));

         if(rhs[i] < R(infinity))
         {
            if(spxAbs(lhs[i] - rhs[i]) < eps)
               rowWeight[i] = r_fixed + n + spxAbs(x);
            else if(lhs[i] > R(-infinity))
            {
               if(x > 0)
               {
                  rowWeight[i] = r_dbl_bounded + x - u + n;
                  rowRight[i]  = true;
               }
               else
               {
                  rowWeight[i] = r_dbl_bounded - x + l + n;
                  rowRight[i]  = false;
               }
            }
            else
            {
               rowWeight[i] = r_bounded - u + n + x;
               rowRight[i]  = true;
            }
         }
         else
         {
            if(lhs[i] > R(-infinity))
            {
               rowWeight[i] = r_bounded + l + n - x;
               rowRight[i]  = false;
            }
            else
            {
               rowWeight[i] = r_free + n - spxAbs(x);
            }
         }
      }
   }

   SPX_DEBUG(
   {
      for(i = 0; i < base.nCols(); i++)
         std::cout << "C i= " << i
                   << " up= " << colUp[i]
                   << " w= " << colWeight[i]
                   << std::endl;
      for(i = 0; i < base.nRows(); i++)
         std::cout << "R i= " << i
                   << " rr= " << rowRight[i]
                   << " w= " << rowWeight[i]
                   << std::endl;
   })
}